

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  Ivy_Cut_t *pIVar14;
  
  uVar2 = pCutNew->uHash;
  if (uVar2 == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x2ea,"int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  uVar3 = pCutStore->nCuts;
  uVar12 = 0;
  uVar13 = 0;
  if (0 < (int)uVar3) {
    uVar13 = (ulong)uVar3;
  }
  piVar11 = pCutStore->pCuts[0].pArray;
  do {
    if (uVar12 == uVar13) {
      if (pCutStore->nCutsMax <= (int)uVar3) {
        __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x317,"int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
      }
      pCutStore->nCuts = uVar3 + 1;
      pCutStore->pCuts[(int)uVar3].uHash = pCutNew->uHash;
      iVar7 = pCutNew->nLatches;
      sVar1 = pCutNew->nSize;
      sVar6 = pCutNew->nSizeMax;
      uVar4 = *(undefined8 *)pCutNew->pArray;
      uVar5 = *(undefined8 *)(pCutNew->pArray + 4);
      piVar11 = pCutStore->pCuts[(int)uVar3].pArray;
      *(undefined8 *)(piVar11 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
      *(undefined8 *)(piVar11 + 4) = uVar5;
      pIVar14 = pCutStore->pCuts + (int)uVar3;
      pIVar14->nLatches = iVar7;
      pIVar14->nSize = sVar1;
      pIVar14->nSizeMax = sVar6;
      *(undefined8 *)pIVar14->pArray = uVar4;
      return 0;
    }
    sVar1 = pCutStore->pCuts[uVar12].nSize;
    if (sVar1 != 0) {
      pIVar14 = pCutStore->pCuts + uVar12;
      if (sVar1 == pCutNew->nSize) {
        if (pIVar14->uHash == uVar2) {
          uVar8 = 0;
          if (0 < sVar1) {
            uVar8 = (ulong)(uint)(int)sVar1;
          }
          for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
            if (piVar11[uVar10] != pCutNew->pArray[uVar10]) {
              uVar8 = uVar10 & 0xffffffff;
              break;
            }
          }
          if ((uint)uVar8 == (int)sVar1) {
            return 1;
          }
        }
      }
      else {
        uVar9 = pIVar14->uHash & uVar2;
        if (sVar1 < pCutNew->nSize) {
          if ((uVar9 == pIVar14->uHash) &&
             (iVar7 = Ivy_CutCheckDominance(pIVar14,pCutNew), iVar7 != 0)) {
            return 1;
          }
        }
        else if ((uVar9 == uVar2) && (iVar7 = Ivy_CutCheckDominance(pCutNew,pIVar14), iVar7 != 0)) {
          pIVar14->nSize = 0;
        }
      }
    }
    uVar12 = uVar12 + 1;
    piVar11 = piVar11 + 9;
  } while( true );
}

Assistant:

int Ivy_NodeCutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
//            --pCutStore->nCuts;
//            for ( k = i; k < pCutStore->nCuts; k++ )
//                pCutStore->pCuts[k] = pCutStore->pCuts[k+1];
//            i--;
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}